

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O2

prsndef * prsxcnd(prscxdef *ctx,prsbdef *binctx)

{
  prsndef *n1;
  prsndef *n2;
  prsndef *n3;
  prsbdef *ppVar1;
  
  ppVar1 = &prsb_or_C;
  if ((ctx->prscxtok->tokcxflg & 4) == 0) {
    ppVar1 = &prsb_or;
  }
  n1 = prsxbin(ctx,ppVar1);
  while ((ctx->prscxtok->tokcxcur).toktyp == 0x56) {
    toknext(ctx->prscxtok);
    n2 = prsxexp(ctx,0);
    prsreq(ctx,0x34);
    ppVar1 = &prsb_asi_C;
    if ((ctx->prscxtok->tokcxflg & 4) == 0) {
      ppVar1 = &prsb_asi;
    }
    n3 = prsxbin(ctx,ppVar1);
    n1 = prsnew3(ctx,0x56,n1,n2,n3);
  }
  return n1;
}

Assistant:

static prsndef *prsxcnd(prscxdef *ctx, prsbdef *binctx)
{
    prsndef *n1, *n2;
    
    VARUSED(binctx);

    n1 = prsxbin(ctx, prs_cmode(ctx) ? &prsb_or_C : &prsb_or);
    for (;;)
    {
        if (ctx->prscxtok->tokcxcur.toktyp != TOKTQUESTION) break;
        toknext(ctx->prscxtok);
        n2 = prsxexp(ctx, FALSE);
        prsreq(ctx, TOKTCOLON);
        n1 = prsnew3(ctx, TOKTQUESTION, n1, n2,
                     prsxbin(ctx, prs_cmode(ctx) ? &prsb_asi_C : &prsb_asi));
    }
    return(n1);
}